

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_uint64(basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            uint64_t val,semantic_tag tag,ser_context *param_4,error_code *ec)

{
  bool bVar1;
  int iVar2;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> d_first;
  ulong uVar3;
  char in_DL;
  ulong in_RSI;
  uint8_t in_stack_0000001f;
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_00000020;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff68;
  bson_errc __e;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint val_00;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff80;
  unsigned_long in_stack_ffffffffffffff88;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff90;
  
  __e = (bson_errc)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  bVar1 = std::
          vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
          ::empty((vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                   *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (bVar1) {
    std::error_code::operator=
              ((error_code *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),__e);
  }
  else if (in_DL == '\x05') {
    if (in_RSI < 0x4189374bc6a7f0) {
      before_value(in_stack_00000020,in_stack_0000001f);
      d_first.container = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RSI * 1000);
      std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_ffffffffffffff58);
      binary::
      native_to_little<long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                (in_stack_ffffffffffffff88,d_first);
    }
    else {
      std::error_code::operator=
                ((error_code *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),__e);
    }
  }
  else if (in_DL == '\x06') {
    before_value(in_stack_00000020,in_stack_0000001f);
    std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_ffffffffffffff58);
    binary::
    native_to_little<long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
              (in_RSI,in_stack_ffffffffffffff90);
  }
  else if (in_DL == '\a') {
    before_value(in_stack_00000020,in_stack_0000001f);
    std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_ffffffffffffff58);
    binary::
    native_to_little<long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  }
  else {
    uVar3 = in_RSI;
    iVar2 = std::numeric_limits<int>::max();
    if ((ulong)(long)iVar2 < uVar3) {
      uVar3 = std::numeric_limits<long>::max();
      if (uVar3 < in_RSI) {
        std::error_code::operator=
                  ((error_code *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (bson_errc)(in_RSI >> 0x20));
      }
      else {
        before_value(in_stack_00000020,in_stack_0000001f);
        std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (in_stack_ffffffffffffff58);
        binary::
        native_to_little<unsigned_long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                  (in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
      }
    }
    else {
      before_value(in_stack_00000020,in_stack_0000001f);
      val_00 = (uint)(uVar3 >> 0x20);
      std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_ffffffffffffff58);
      binary::
      native_to_little<unsigned_int,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                (val_00,in_stack_ffffffffffffff80);
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t val, 
        semantic_tag tag, 
        const ser_context&,
        std::error_code& ec) override
    {
        static constexpr uint64_t max_value_div_1000 = (std::numeric_limits<uint64_t>::max)() / 1000;
        if (stack_.empty())
        {
            ec = bson_errc::expected_bson_document;
            JSONCONS_VISITOR_RETURN;
        }

        switch (tag)
        {
            case semantic_tag::epoch_second:
                if (val > max_value_div_1000)
                {
                    ec = bson_errc::datetime_too_large;
                    JSONCONS_VISITOR_RETURN;
                }
                before_value(jsoncons::bson::bson_type::datetime_type);
                binary::native_to_little(static_cast<int64_t>(val*millis_in_second),std::back_inserter(buffer_));
                break;
            case semantic_tag::epoch_milli:
                before_value(jsoncons::bson::bson_type::datetime_type);
                binary::native_to_little(static_cast<int64_t>(val),std::back_inserter(buffer_));
                break;
            case semantic_tag::epoch_nano:
                before_value(jsoncons::bson::bson_type::datetime_type);
                if (val != 0)
                {
                    val /= nanos_in_second;
                }
                binary::native_to_little(static_cast<int64_t>(val),std::back_inserter(buffer_));
                break;
            default:
            {
                if (val <= static_cast<uint64_t>((std::numeric_limits<int32_t>::max)()))
                {
                    before_value(jsoncons::bson::bson_type::int32_type);
                    binary::native_to_little(static_cast<uint32_t>(val),std::back_inserter(buffer_));
                }
                else if (val <= static_cast<uint64_t>((std::numeric_limits<int64_t>::max)()))
                {
                    before_value(jsoncons::bson::bson_type::int64_type);
                    binary::native_to_little(static_cast<uint64_t>(val),std::back_inserter(buffer_));
                }
                else
                {
                    ec = bson_errc::number_too_large;
                    JSONCONS_VISITOR_RETURN;
                }
                break;
            }
        }
        JSONCONS_VISITOR_RETURN;
    }